

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void parse_query_params(CVmObjLookupTable *tab,char *p,int encmode)

{
  CVmObjLookupTable *tab_00;
  size_t sVar1;
  CVmObjLookupTable *keystr;
  CVmObjLookupTable *in_RSI;
  char *eq;
  char *amp;
  CVmObjLookupTable *in_stack_ffffffffffffffd0;
  CVmObjLookupTable *local_10;
  
  local_10 = in_RSI;
  while (*(char *)&(local_10->super_CVmObjCollection).super_CVmObject._vptr_CVmObject != '\0') {
    tab_00 = (CVmObjLookupTable *)strchr((char *)local_10,0x26);
    if (tab_00 == (CVmObjLookupTable *)0x0) {
      in_stack_ffffffffffffffd0 = local_10;
      sVar1 = strlen((char *)local_10);
      tab_00 = (CVmObjLookupTable *)
               ((long)&(in_stack_ffffffffffffffd0->super_CVmObjCollection).super_CVmObject.
                       _vptr_CVmObject + sVar1);
    }
    keystr = (CVmObjLookupTable *)strchr((char *)local_10,0x3d);
    if ((keystr == (CVmObjLookupTable *)0x0) || (tab_00 < keystr)) {
      keystr = tab_00;
    }
    add_parsed_val(tab_00,(char *)keystr,(size_t)in_stack_ffffffffffffffd0,
                   (char *)((long)&(keystr->super_CVmObjCollection).super_CVmObject._vptr_CVmObject
                           + 1),(long)keystr - (long)local_10,(int)((ulong)local_10 >> 0x20));
    local_10 = tab_00;
    if (*(char *)&(tab_00->super_CVmObjCollection).super_CVmObject._vptr_CVmObject != '\0') {
      local_10 = (CVmObjLookupTable *)
                 ((long)&(tab_00->super_CVmObjCollection).super_CVmObject._vptr_CVmObject + 1);
    }
  }
  return;
}

Assistant:

static void parse_query_params(VMG_ CVmObjLookupTable *tab, const char *p,
                               int encmode)
{
    /* parse the arguments */
    while (*p != '\0')
    {
        /* the end of this argument is at the next '&' */
        const char *amp = strchr(p, '&');
        if (amp == 0)
            amp = p + strlen(p);

        /* find the '=', if any */
        const char *eq = strchr(p, '=');
        if (eq == 0 || eq > amp)
            eq = amp;

        /* add the resource name under the name key */
        add_parsed_val(vmg_ tab, p, eq - p,
                       eq + 1, eq == amp ? 0 : amp - eq - 1, encmode);

        /* move on to the next delimiter */
        p = amp;
        if (*p != '\0')
            ++p;
    }
}